

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  __int32_t *p_Var2;
  int iVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  long lVar6;
  cJSON *pcVar7;
  int iVar8;
  
  if (name != (char *)0x0 && object != (cJSON *)0x0) {
    pcVar7 = object->child;
    if (case_sensitive == 0) {
      for (; pcVar7 != (cJSON *)0x0; pcVar7 = pcVar7->next) {
        pbVar1 = (byte *)pcVar7->string;
        if (pbVar1 != (byte *)0x0) {
          if (pbVar1 == (byte *)name) goto LAB_001042be;
          pp_Var4 = __ctype_tolower_loc();
          p_Var2 = *pp_Var4;
          uVar5 = (ulong)(byte)*name;
          iVar3 = p_Var2[uVar5];
          iVar8 = p_Var2[*pbVar1];
          if (iVar3 == iVar8) {
            lVar6 = 1;
            do {
              if ((char)uVar5 == '\0') goto LAB_001042be;
              uVar5 = (ulong)(byte)name[lVar6];
              iVar3 = p_Var2[uVar5];
              iVar8 = p_Var2[pbVar1[lVar6]];
              lVar6 = lVar6 + 1;
            } while (iVar3 == iVar8);
          }
          if (iVar3 == iVar8) goto LAB_001042be;
        }
      }
    }
    else {
      for (; pcVar7 != (cJSON *)0x0; pcVar7 = pcVar7->next) {
        if ((pcVar7->string == (char *)0x0) || (iVar3 = strcmp(name,pcVar7->string), iVar3 == 0))
        goto LAB_001042be;
      }
    }
    pcVar7 = (cJSON *)0x0;
LAB_001042be:
    if (pcVar7 != (cJSON *)0x0) {
      if (pcVar7->string != (char *)0x0) {
        return pcVar7;
      }
      return (cJSON *)0x0;
    }
  }
  return (cJSON *)0x0;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (current_element->string != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
        while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    if ((current_element == NULL) || (current_element->string == NULL)) {
        return NULL;
    }

    return current_element;
}